

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O1

void __thiscall
ipx::Model::DualizeBackBasis
          (Model *this,vector<int,_std::allocator<int>_> *basic_status_solver,
          vector<int,_std::allocator<int>_> *cbasis_user,
          vector<int,_std::allocator<int>_> *vbasis_user)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  double *pdVar4;
  int *piVar5;
  int *piVar6;
  uint uVar7;
  int *piVar8;
  long lVar9;
  
  iVar1 = this->num_cols_;
  if (this->dualized_ == false) {
    if (0 < this->num_constr_) {
      piVar2 = (cbasis_user->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (basic_status_solver->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        piVar2[lVar9] = -(uint)(piVar3[iVar1 + lVar9] != 0);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_constr_);
    }
    if (0 < this->num_var_) {
      piVar2 = (basic_status_solver->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (vbasis_user->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        piVar3[lVar9] = piVar2[lVar9];
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_var_);
    }
  }
  else {
    if (0 < this->num_constr_) {
      piVar2 = (basic_status_solver->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (cbasis_user->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar9 = 0;
      do {
        piVar3[lVar9] = -(uint)(piVar2[lVar9] == 0);
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_constr_);
    }
    if (0 < this->num_var_) {
      piVar2 = (vbasis_user->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar3 = (basic_status_solver->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->scaled_lbuser_)._M_data;
      lVar9 = 0;
      do {
        uVar7 = 0;
        if (piVar3[iVar1 + lVar9] == 0) {
          uVar7 = -(uint)((ulong)ABS(pdVar4[lVar9]) < 0x7ff0000000000000) | 0xfffffffd;
        }
        piVar2[lVar9] = uVar7;
        lVar9 = lVar9 + 1;
      } while (lVar9 < this->num_var_);
    }
    piVar6 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar5 = (this->boxed_vars_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (piVar6 != piVar5) {
      piVar2 = (vbasis_user->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar8 = (basic_status_solver->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start + this->num_constr_;
      do {
        if (*piVar8 == 0) {
          piVar2[*piVar6] = -2;
        }
        piVar6 = piVar6 + 1;
        piVar8 = piVar8 + 1;
      } while (piVar6 != piVar5);
    }
  }
  return;
}

Assistant:

void Model::clear() {
    // clear computational form model
    dualized_ = false;
    num_rows_ = 0;
    num_cols_ = 0;
    num_dense_cols_ = 0;
    nz_dense_ = 0;
    AI_.clear();
    AIt_.clear();
    b_.resize(0);
    c_.resize(0);
    lb_.resize(0);
    ub_.resize(0);
    norm_bounds_ = 0.0;
    norm_c_ = 0.0;

    // clear user model
    num_constr_ = 0;
    num_eqconstr_ = 0;
    num_var_ = 0;
    num_free_var_ = 0;
    num_entries_ = 0;
    boxed_vars_.clear();
    constr_type_.clear();
    norm_obj_ = 0.0;
    norm_rhs_ = 0.0;
    scaled_obj_.resize(0);
    scaled_rhs_.resize(0);
    scaled_lbuser_.resize(0);
    scaled_ubuser_.resize(0);
    A_.clear();

    flipped_vars_.clear();
    colscale_.resize(0);
    rowscale_.resize(0);
}